

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O2

int format_hex(int64_t v,void *p,int digits)

{
  ulong uVar1;
  ulong v_00;
  
  uVar1 = ~(-1L << ((char)digits * '\x04' & 0x3fU));
  v_00 = v;
  if ((long)uVar1 < v || v < 0) {
    v_00 = uVar1;
  }
  format_hex_recursive(v_00,(char *)p,digits);
  return -(uint)((long)uVar1 < v || v < 0);
}

Assistant:

static int
format_hex(int64_t v, void *p, int digits)
{
	int64_t	max;
	int	ret;

	max = (((int64_t)1) << (digits * 4)) - 1;
	if (v >= 0  &&  v <= max) {
	    format_hex_recursive(v, (char *)p, digits);
	    ret = 0;
	} else {
	    format_hex_recursive(max, (char *)p, digits);
	    ret = -1;
	}
	return (ret);
}